

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools_common.c
# Opt level: O3

int read_yuv_frame(AvxInputContext *input_ctx,aom_image_t *yuv_frame)

{
  size_t *psVar1;
  aom_img_fmt_t aVar2;
  aom_img_fmt_t aVar3;
  FILE *__stream;
  size_t sVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  long lVar8;
  ulong __n;
  int plane;
  ulong __n_00;
  long lVar9;
  ulong uVar10;
  uchar *__dest;
  uint local_5c;
  
  __stream = (FILE *)input_ctx->file;
  aVar2 = yuv_frame->fmt;
  lVar9 = 0;
  local_5c = 0;
  do {
    plane = (int)lVar9;
    iVar5 = aom_img_plane_width(yuv_frame,plane);
    iVar6 = aom_img_plane_height(yuv_frame,plane);
    aVar3 = yuv_frame->fmt;
    if (lVar9 == 2 && aVar3 == AOM_IMG_FMT_NV12) {
      return local_5c;
    }
    if (plane == 2) {
      lVar8 = (ulong)(aVar3 != AOM_IMG_FMT_YV12) + 1;
    }
    else {
      lVar8 = lVar9;
      if (plane == 1) {
        lVar8 = (ulong)(aVar3 == AOM_IMG_FMT_YV12) + 1;
      }
    }
    if (0 < iVar6) {
      __dest = yuv_frame->planes[lVar8];
      uVar10 = (ulong)((iVar5 << (lVar9 == 1 && aVar3 == AOM_IMG_FMT_NV12)) <<
                      ((byte)(aVar2 >> 0xb) & 1));
      do {
        sVar4 = (input_ctx->detect).position;
        __n = (input_ctx->detect).buf_read - sVar4;
        if (__n == 0) {
          __n = 0;
          __n_00 = uVar10;
        }
        else {
          if (uVar10 <= __n) {
            __n = uVar10;
          }
          memcpy(__dest,(input_ctx->detect).buf + sVar4,__n);
          __n_00 = uVar10 - __n;
          psVar1 = &(input_ctx->detect).position;
          *psVar1 = *psVar1 + __n;
        }
        if (__n_00 != 0) {
          sVar7 = fread(__dest + __n,1,__n_00,__stream);
          local_5c = local_5c | sVar7 < __n_00;
        }
        __dest = __dest + yuv_frame->stride[lVar9];
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
  return local_5c;
}

Assistant:

int read_yuv_frame(struct AvxInputContext *input_ctx, aom_image_t *yuv_frame) {
  FILE *f = input_ctx->file;
  struct FileTypeDetectionBuffer *detect = &input_ctx->detect;
  int plane = 0;
  int shortread = 0;
  const int bytespp = (yuv_frame->fmt & AOM_IMG_FMT_HIGHBITDEPTH) ? 2 : 1;

  for (plane = 0; plane < 3; ++plane) {
    uint8_t *ptr;
    int w = aom_img_plane_width(yuv_frame, plane);
    const int h = aom_img_plane_height(yuv_frame, plane);
    int r;
    // Assuming that for nv12 we read all chroma data at once
    if (yuv_frame->fmt == AOM_IMG_FMT_NV12 && plane > 1) break;
    if (yuv_frame->fmt == AOM_IMG_FMT_NV12 && plane == 1) w *= 2;
    /* Determine the correct plane based on the image format. The for-loop
     * always counts in Y,U,V order, but this may not match the order of
     * the data on disk.
     */
    switch (plane) {
      case 1:
        ptr =
            yuv_frame->planes[yuv_frame->fmt == AOM_IMG_FMT_YV12 ? AOM_PLANE_V
                                                                 : AOM_PLANE_U];
        break;
      case 2:
        ptr =
            yuv_frame->planes[yuv_frame->fmt == AOM_IMG_FMT_YV12 ? AOM_PLANE_U
                                                                 : AOM_PLANE_V];
        break;
      default: ptr = yuv_frame->planes[plane];
    }

    for (r = 0; r < h; ++r) {
      size_t needed = w * bytespp;
      size_t buf_position = 0;
      const size_t left = detect->buf_read - detect->position;
      if (left > 0) {
        const size_t more = (left < needed) ? left : needed;
        memcpy(ptr, detect->buf + detect->position, more);
        buf_position = more;
        needed -= more;
        detect->position += more;
      }
      if (needed > 0) {
        shortread |= (fread(ptr + buf_position, 1, needed, f) < needed);
      }

      ptr += yuv_frame->stride[plane];
    }
  }

  return shortread;
}